

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_EndpointType.h
# Opt level: O2

bool soul::isMIDIEventEndpoint(Endpoint *details)

{
  bool bVar1;
  
  if (details->type != event) {
    return false;
  }
  if ((*(long *)&details->field_0x50 - (long)*(Type **)&details->valueTypes == 0x20) &&
     (bVar1 = isMIDIMessageStruct(*(Type **)&details->valueTypes), bVar1)) {
    bVar1 = isConsoleEndpoint(&details->name);
    return !bVar1;
  }
  return false;
}

Assistant:

inline bool isEvent  (EndpointType t)         { return t == EndpointType::event; }